

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::gather<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,int root,comm *comm)

{
  datatype dt;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::gather_big<std::pair<int,double>>(data,size,out,root,comm);
    return;
  }
  dt.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  dt.builtin = false;
  MPI_Gather(data,size & 0xffffffff,dt.mpitype,out,size & 0xffffffff,dt.mpitype,root,comm->mpi_comm)
  ;
  datatype::~datatype(&dt);
  return;
}

Assistant:

void gather(const T* data, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        // use custom implementation for big data
        impl::gather_big(data, size, out, root, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Gather(const_cast<T*>(data), size, dt.type(), out, size, dt.type(), root, comm);
    }
}